

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

int ec_seckey_export_der
              (secp256k1_context *ctx,uchar *seckey,size_t *seckeylen,uchar *key32,bool compressed)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long in_FS_OFFSET;
  secp256k1_pubkey pubkey;
  size_t local_80;
  secp256k1_pubkey local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*seckeylen < 0x117) {
    __assert_fail("*seckeylen >= CKey::SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x60,
                  "int ec_seckey_export_der(const secp256k1_context *, unsigned char *, size_t *, const unsigned char *, bool)"
                 );
  }
  iVar4 = secp256k1_ec_pubkey_create(ctx,&local_78,key32);
  if (iVar4 == 0) {
    *seckeylen = 0;
    iVar4 = 0;
  }
  else if (compressed) {
    seckey[0] = '0';
    seckey[1] = 0x81;
    seckey[2] = 0xd3;
    seckey[3] = '\x02';
    seckey[4] = '\x01';
    seckey[5] = '\x01';
    seckey[6] = '\x04';
    seckey[7] = ' ';
    uVar1 = *(undefined8 *)(key32 + 8);
    uVar2 = *(undefined8 *)(key32 + 0x10);
    uVar3 = *(undefined8 *)(key32 + 0x18);
    *(undefined8 *)(seckey + 8) = *(undefined8 *)key32;
    *(undefined8 *)(seckey + 0x10) = uVar1;
    *(undefined8 *)(seckey + 0x18) = uVar2;
    *(undefined8 *)(seckey + 0x20) = uVar3;
    memcpy(seckey + 0x28,ec_seckey_export_der::middle,0x8d);
    local_80 = 0x21;
    secp256k1_ec_pubkey_serialize(ctx,seckey + 0xb5,&local_80,&local_78,0x102);
    *seckeylen = local_80 + 0xb5;
    iVar4 = 1;
    if (local_80 + 0xb5 != 0xd6) {
      __assert_fail("*seckeylen == CKey::COMPRESSED_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x7e,
                    "int ec_seckey_export_der(const secp256k1_context *, unsigned char *, size_t *, const unsigned char *, bool)"
                   );
    }
  }
  else {
    seckey[0] = '0';
    seckey[1] = 0x82;
    seckey[2] = '\x01';
    seckey[3] = '\x13';
    seckey[4] = '\x02';
    seckey[5] = '\x01';
    seckey[6] = '\x01';
    seckey[7] = '\x04';
    seckey[8] = ' ';
    uVar1 = *(undefined8 *)(key32 + 8);
    uVar2 = *(undefined8 *)(key32 + 0x10);
    uVar3 = *(undefined8 *)(key32 + 0x18);
    *(undefined8 *)(seckey + 9) = *(undefined8 *)key32;
    *(undefined8 *)(seckey + 0x11) = uVar1;
    *(undefined8 *)(seckey + 0x19) = uVar2;
    *(undefined8 *)(seckey + 0x21) = uVar3;
    memcpy(seckey + 0x29,
           ec_seckey_export_der(secp256k1_context_struct_const*,unsigned_char*,unsigned_long*,unsigned_char_const*,bool)
           ::middle,0xad);
    local_80 = 0x41;
    secp256k1_ec_pubkey_serialize(ctx,seckey + 0xd6,&local_80,&local_78,2);
    *seckeylen = local_80 + 0xd6;
    iVar4 = 1;
    if (local_80 + 0xd6 != 0x117) {
      __assert_fail("*seckeylen == CKey::SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x98,
                    "int ec_seckey_export_der(const secp256k1_context *, unsigned char *, size_t *, const unsigned char *, bool)"
                   );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int ec_seckey_export_der(const secp256k1_context *ctx, unsigned char *seckey, size_t *seckeylen, const unsigned char *key32, bool compressed) {
    assert(*seckeylen >= CKey::SIZE);
    secp256k1_pubkey pubkey;
    size_t pubkeylen = 0;
    if (!secp256k1_ec_pubkey_create(ctx, &pubkey, key32)) {
        *seckeylen = 0;
        return 0;
    }
    if (compressed) {
        static const unsigned char begin[] = {
            0x30,0x81,0xD3,0x02,0x01,0x01,0x04,0x20
        };
        static const unsigned char middle[] = {
            0xA0,0x81,0x85,0x30,0x81,0x82,0x02,0x01,0x01,0x30,0x2C,0x06,0x07,0x2A,0x86,0x48,
            0xCE,0x3D,0x01,0x01,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFE,0xFF,0xFF,0xFC,0x2F,0x30,0x06,0x04,0x01,0x00,0x04,0x01,0x07,0x04,
            0x21,0x02,0x79,0xBE,0x66,0x7E,0xF9,0xDC,0xBB,0xAC,0x55,0xA0,0x62,0x95,0xCE,0x87,
            0x0B,0x07,0x02,0x9B,0xFC,0xDB,0x2D,0xCE,0x28,0xD9,0x59,0xF2,0x81,0x5B,0x16,0xF8,
            0x17,0x98,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFE,0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,0xBF,0xD2,0x5E,
            0x8C,0xD0,0x36,0x41,0x41,0x02,0x01,0x01,0xA1,0x24,0x03,0x22,0x00
        };
        unsigned char *ptr = seckey;
        memcpy(ptr, begin, sizeof(begin)); ptr += sizeof(begin);
        memcpy(ptr, key32, 32); ptr += 32;
        memcpy(ptr, middle, sizeof(middle)); ptr += sizeof(middle);
        pubkeylen = CPubKey::COMPRESSED_SIZE;
        secp256k1_ec_pubkey_serialize(ctx, ptr, &pubkeylen, &pubkey, SECP256K1_EC_COMPRESSED);
        ptr += pubkeylen;
        *seckeylen = ptr - seckey;
        assert(*seckeylen == CKey::COMPRESSED_SIZE);
    } else {
        static const unsigned char begin[] = {
            0x30,0x82,0x01,0x13,0x02,0x01,0x01,0x04,0x20
        };
        static const unsigned char middle[] = {
            0xA0,0x81,0xA5,0x30,0x81,0xA2,0x02,0x01,0x01,0x30,0x2C,0x06,0x07,0x2A,0x86,0x48,
            0xCE,0x3D,0x01,0x01,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFE,0xFF,0xFF,0xFC,0x2F,0x30,0x06,0x04,0x01,0x00,0x04,0x01,0x07,0x04,
            0x41,0x04,0x79,0xBE,0x66,0x7E,0xF9,0xDC,0xBB,0xAC,0x55,0xA0,0x62,0x95,0xCE,0x87,
            0x0B,0x07,0x02,0x9B,0xFC,0xDB,0x2D,0xCE,0x28,0xD9,0x59,0xF2,0x81,0x5B,0x16,0xF8,
            0x17,0x98,0x48,0x3A,0xDA,0x77,0x26,0xA3,0xC4,0x65,0x5D,0xA4,0xFB,0xFC,0x0E,0x11,
            0x08,0xA8,0xFD,0x17,0xB4,0x48,0xA6,0x85,0x54,0x19,0x9C,0x47,0xD0,0x8F,0xFB,0x10,
            0xD4,0xB8,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFE,0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,0xBF,0xD2,0x5E,
            0x8C,0xD0,0x36,0x41,0x41,0x02,0x01,0x01,0xA1,0x44,0x03,0x42,0x00
        };
        unsigned char *ptr = seckey;
        memcpy(ptr, begin, sizeof(begin)); ptr += sizeof(begin);
        memcpy(ptr, key32, 32); ptr += 32;
        memcpy(ptr, middle, sizeof(middle)); ptr += sizeof(middle);
        pubkeylen = CPubKey::SIZE;
        secp256k1_ec_pubkey_serialize(ctx, ptr, &pubkeylen, &pubkey, SECP256K1_EC_UNCOMPRESSED);
        ptr += pubkeylen;
        *seckeylen = ptr - seckey;
        assert(*seckeylen == CKey::SIZE);
    }
    return 1;
}